

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_edit.cc
# Opt level: O0

string * __thiscall leveldb::VersionEdit::DebugString_abi_cxx11_(VersionEdit *this)

{
  bool bVar1;
  _Rb_tree_const_iterator<std::pair<int,_unsigned_long>_> *p_Var2;
  size_type sVar3;
  const_reference pvVar4;
  uint64_t in_RSI;
  string *in_RDI;
  FileMetaData *f;
  size_t i_1;
  pair<int,_unsigned_long> *deleted_files_kvp;
  iterator __end1;
  iterator __begin1;
  DeletedFileSet *__range1;
  size_t i;
  string *r;
  InternalKey *in_stack_00000118;
  set<std::pair<int,_unsigned_long>,_std::less<std::pair<int,_unsigned_long>_>,_std::allocator<std::pair<int,_unsigned_long>_>_>
  *in_stack_ffffffffffffff28;
  ulong uVar5;
  _Rb_tree_const_iterator<std::pair<int,_unsigned_long>_> *this_00;
  string *in_stack_ffffffffffffff50;
  string local_90 [32];
  FileMetaData *local_70;
  ulong local_68;
  reference local_60;
  _Self local_58;
  _Self local_50;
  long local_48;
  string local_40 [32];
  _Rb_tree_const_iterator<std::pair<int,_unsigned_long>_> *local_20;
  undefined1 local_11;
  
  local_11 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  if ((*(byte *)(in_RSI + 0x40) & 1) != 0) {
    std::__cxx11::string::append((char *)in_RDI);
    std::__cxx11::string::append((string *)in_RDI);
  }
  if ((*(byte *)(in_RSI + 0x41) & 1) != 0) {
    std::__cxx11::string::append((char *)in_RDI);
    AppendNumberTo(in_stack_ffffffffffffff50,in_RSI);
  }
  if ((*(byte *)(in_RSI + 0x42) & 1) != 0) {
    std::__cxx11::string::append((char *)in_RDI);
    AppendNumberTo(in_stack_ffffffffffffff50,in_RSI);
  }
  if ((*(byte *)(in_RSI + 0x43) & 1) != 0) {
    std::__cxx11::string::append((char *)in_RDI);
    AppendNumberTo(in_stack_ffffffffffffff50,in_RSI);
  }
  if ((*(byte *)(in_RSI + 0x44) & 1) != 0) {
    std::__cxx11::string::append((char *)in_RDI);
    AppendNumberTo(in_stack_ffffffffffffff50,in_RSI);
  }
  local_20 = (_Rb_tree_const_iterator<std::pair<int,_unsigned_long>_> *)0x0;
  while (this_00 = local_20,
        p_Var2 = (_Rb_tree_const_iterator<std::pair<int,_unsigned_long>_> *)
                 std::
                 vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                 ::size((vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                         *)(in_RSI + 0x48)), this_00 < p_Var2) {
    std::__cxx11::string::append((char *)in_RDI);
    std::
    vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
    ::operator[]((vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                  *)(in_RSI + 0x48),(size_type)local_20);
    AppendNumberTo(in_stack_ffffffffffffff50,in_RSI);
    std::__cxx11::string::append((char *)in_RDI);
    std::
    vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
    ::operator[]((vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                  *)(in_RSI + 0x48),(size_type)local_20);
    InternalKey::DebugString_abi_cxx11_(in_stack_00000118);
    std::__cxx11::string::append((string *)in_RDI);
    std::__cxx11::string::~string(local_40);
    local_20 = (_Rb_tree_const_iterator<std::pair<int,_unsigned_long>_> *)
               ((long)&local_20->_M_node + 1);
  }
  local_48 = in_RSI + 0x60;
  local_50._M_node =
       (_Base_ptr)
       std::
       set<std::pair<int,_unsigned_long>,_std::less<std::pair<int,_unsigned_long>_>,_std::allocator<std::pair<int,_unsigned_long>_>_>
       ::begin(in_stack_ffffffffffffff28);
  local_58._M_node =
       (_Base_ptr)
       std::
       set<std::pair<int,_unsigned_long>,_std::less<std::pair<int,_unsigned_long>_>,_std::allocator<std::pair<int,_unsigned_long>_>_>
       ::end(in_stack_ffffffffffffff28);
  while (bVar1 = std::operator!=(&local_50,&local_58), bVar1) {
    local_60 = std::_Rb_tree_const_iterator<std::pair<int,_unsigned_long>_>::operator*
                         ((_Rb_tree_const_iterator<std::pair<int,_unsigned_long>_> *)0x10a568);
    std::__cxx11::string::append((char *)in_RDI);
    AppendNumberTo(in_stack_ffffffffffffff50,in_RSI);
    std::__cxx11::string::append((char *)in_RDI);
    AppendNumberTo(in_stack_ffffffffffffff50,in_RSI);
    std::_Rb_tree_const_iterator<std::pair<int,_unsigned_long>_>::operator++(this_00);
  }
  local_68 = 0;
  while (uVar5 = local_68,
        sVar3 = std::
                vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                ::size((vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                        *)(in_RSI + 0x90)), uVar5 < sVar3) {
    pvVar4 = std::
             vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
             ::operator[]((vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                           *)(in_RSI + 0x90),local_68);
    local_70 = &pvVar4->second;
    std::__cxx11::string::append((char *)in_RDI);
    std::
    vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
    ::operator[]((vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                  *)(in_RSI + 0x90),local_68);
    AppendNumberTo(in_stack_ffffffffffffff50,in_RSI);
    std::__cxx11::string::append((char *)in_RDI);
    AppendNumberTo(in_stack_ffffffffffffff50,in_RSI);
    std::__cxx11::string::append((char *)in_RDI);
    AppendNumberTo(in_stack_ffffffffffffff50,in_RSI);
    std::__cxx11::string::append((char *)in_RDI);
    InternalKey::DebugString_abi_cxx11_(in_stack_00000118);
    std::__cxx11::string::append((string *)in_RDI);
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::append((char *)in_RDI);
    InternalKey::DebugString_abi_cxx11_(in_stack_00000118);
    std::__cxx11::string::append((string *)in_RDI);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
    local_68 = local_68 + 1;
  }
  std::__cxx11::string::append((char *)in_RDI);
  return in_RDI;
}

Assistant:

std::string VersionEdit::DebugString() const {
  std::string r;
  r.append("VersionEdit {");
  if (has_comparator_) {
    r.append("\n  Comparator: ");
    r.append(comparator_);
  }
  if (has_log_number_) {
    r.append("\n  LogNumber: ");
    AppendNumberTo(&r, log_number_);
  }
  if (has_prev_log_number_) {
    r.append("\n  PrevLogNumber: ");
    AppendNumberTo(&r, prev_log_number_);
  }
  if (has_next_file_number_) {
    r.append("\n  NextFile: ");
    AppendNumberTo(&r, next_file_number_);
  }
  if (has_last_sequence_) {
    r.append("\n  LastSeq: ");
    AppendNumberTo(&r, last_sequence_);
  }
  for (size_t i = 0; i < compact_pointers_.size(); i++) {
    r.append("\n  CompactPointer: ");
    AppendNumberTo(&r, compact_pointers_[i].first);
    r.append(" ");
    r.append(compact_pointers_[i].second.DebugString());
  }
  for (const auto& deleted_files_kvp : deleted_files_) {
    r.append("\n  DeleteFile: ");
    AppendNumberTo(&r, deleted_files_kvp.first);
    r.append(" ");
    AppendNumberTo(&r, deleted_files_kvp.second);
  }
  for (size_t i = 0; i < new_files_.size(); i++) {
    const FileMetaData& f = new_files_[i].second;
    r.append("\n  AddFile: ");
    AppendNumberTo(&r, new_files_[i].first);
    r.append(" ");
    AppendNumberTo(&r, f.number);
    r.append(" ");
    AppendNumberTo(&r, f.file_size);
    r.append(" ");
    r.append(f.smallest.DebugString());
    r.append(" .. ");
    r.append(f.largest.DebugString());
  }
  r.append("\n}\n");
  return r;
}